

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O0

void sv_send_cb(uv_udp_send_t *req,int status)

{
  int status_local;
  uv_udp_send_t *req_local;
  
  if (req == (uv_udp_send_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
            ,0x69,"req != NULL");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
            ,0x6a,"status == 0");
    abort();
  }
  if ((req->handle != &server) && (req->handle != &client)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-and-recv.c"
            ,0x6b,"(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client");
    abort();
  }
  uv_close(req->handle,close_cb);
  free(req);
  sv_send_cb_called = sv_send_cb_called + 1;
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT(req != NULL);
  ASSERT(status == 0);
  CHECK_HANDLE(req->handle);

  sv_send_cb_called++;

  if (sv_send_cb_called == 2)
    uv_close((uv_handle_t*) req->handle, close_cb);
}